

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Promise<kj::AsyncCapabilityStream::ReadResult> __thiscall
kj::anon_unknown_0::AsyncStreamFd::tryReadInternal
          (AsyncStreamFd *this,void *buffer,size_t minBytes,size_t maxBytes,OwnFd *fdBuffer,
          size_t maxFds,ReadResult alreadyRead)

{
  ArrayDisposer **this_00;
  ReadResult alreadyRead_00;
  FixVoid<kj::AsyncCapabilityStream::ReadResult> value;
  FixVoid<kj::AsyncCapabilityStream::ReadResult> value_00;
  FixVoid<kj::AsyncCapabilityStream::ReadResult> value_01;
  bool bVar1;
  int iVar2;
  kj *this_01;
  uchar *__s;
  size_t sVar3;
  void *pvVar4;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> WVar5;
  OwnFd *pOVar6;
  Function<void_(kj::ArrayPtr<kj::AncillaryMessage>)> *this_02;
  unsigned_long uVar7;
  size_t size;
  ArrayPtr<void_*> AVar8;
  ArrayPtr<unsigned_char> AVar9;
  ArrayPtr<int> AVar10;
  Disposer *in_stack_00000018;
  uchar *local_3a8;
  undefined1 local_2c0 [48];
  Function<void_(kj::ArrayPtr<kj::AncillaryMessage>)> *fn;
  Function<void_(kj::ArrayPtr<kj::AncillaryMessage>)> *_fn701;
  ArrayPtr<const_unsigned_char> data_1;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> len_1;
  OwnFd local_268;
  int local_264;
  OwnFd ownFd;
  int fd;
  int *__end6;
  int *__begin6;
  ArrayPtr<int> *__range6;
  Vector<kj::OwnFd> trashFds;
  ArrayPtr<int> data;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> len;
  cmsghdr *cmsg;
  Vector<kj::AncillaryMessage> ancillaryMessages;
  size_t spaceLeft;
  size_t nfds;
  Fault f_1;
  SyscallResult local_1b4;
  undefined1 auStack_1b0 [4];
  SyscallResult _kjSyscallResult_1;
  ArrayPtr<unsigned_char> cmsgBytes;
  ArrayPtr<void_*> cmsgSpace;
  Array<void_*> cmsgSpace_heap;
  void *cmsgSpace_stack [16];
  bool cmsgSpace_isOnStack;
  size_t cmsgSpace_size;
  size_t msgWords;
  ArrayDisposer *local_d0;
  size_t msgBytes;
  iovec iov;
  msghdr msg;
  Fault local_70;
  Fault f;
  SyscallResult local_48 [2];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  OwnFd *fdBuffer_local;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  AsyncStreamFd *this_local;
  
  n = maxFds;
  if ((alreadyRead.byteCount == 0) &&
     (bVar1 = Maybe<kj::Function<void_(kj::ArrayPtr<kj::AncillaryMessage>)>_>::operator==
                        ((Maybe<kj::Function<void_(kj::ArrayPtr<kj::AncillaryMessage>)>_> *)
                         ((long)buffer + 0x90)), bVar1)) {
    f.exception = (Exception *)&_kjSyscallResult;
    local_48[0] = kj::_::Debug::
                  syscall<kj::(anonymous_namespace)::AsyncStreamFd::tryReadInternal(void*,unsigned_long,unsigned_long,kj::OwnFd*,unsigned_long,kj::AsyncCapabilityStream::ReadResult)::_lambda()_1_>
                            ((anon_class_32_4_f0ba1e86 *)&f,true);
    pvVar4 = kj::_::Debug::SyscallResult::operator_cast_to_void_(local_48);
    if (pvVar4 != (void *)0x0) {
LAB_00903bee:
      if ((long)__kjSyscallResult < 0) {
        UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_2c0);
        Promise<void>::
        then<kj::(anonymous_namespace)::AsyncStreamFd::tryReadInternal(void*,unsigned_long,unsigned_long,kj::OwnFd*,unsigned_long,kj::AsyncCapabilityStream::ReadResult)::_lambda()_3_>
                  ((Promise<void> *)this,(Type *)local_2c0);
        Promise<void>::~Promise((Promise<void> *)local_2c0);
        return (PromiseBase)(PromiseBase)this;
      }
      if (__kjSyscallResult == (char *)0x0) {
        value_00.capCount = (size_t)in_stack_00000018;
        value_00.byteCount = alreadyRead.capCount;
        Promise<kj::AsyncCapabilityStream::ReadResult>::Promise
                  ((Promise<kj::AsyncCapabilityStream::ReadResult> *)this,value_00);
        return (PromiseBase)(PromiseBase)this;
      }
      uVar7 = implicitCast<unsigned_long,long&>((long *)&_kjSyscallResult);
      if (maxBytes <= uVar7) {
        value_01.capCount = (size_t)in_stack_00000018;
        value_01.byteCount = (size_t)(__kjSyscallResult + alreadyRead.capCount);
        Promise<kj::AsyncCapabilityStream::ReadResult>::Promise
                  ((Promise<kj::AsyncCapabilityStream::ReadResult> *)this,value_01);
        return (PromiseBase)(PromiseBase)this;
      }
      alreadyRead_00.capCount = (size_t)(__kjSyscallResult + alreadyRead.capCount);
      alreadyRead_00.byteCount = alreadyRead.byteCount;
      tryReadInternal(this,buffer,(size_t)(__kjSyscallResult + minBytes),
                      maxBytes - (long)__kjSyscallResult,
                      (OwnFd *)((long)fdBuffer - (long)__kjSyscallResult),n,alreadyRead_00);
      return (PromiseBase)(PromiseBase)this;
    }
    iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(local_48);
    kj::_::Debug::Fault::Fault
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x238,iVar2,"n = ::read(fd, buffer, maxBytes)","");
    kj::_::Debug::Fault::~Fault(&local_70);
  }
  else {
    memset(&iov.iov_len,0,0x38);
    memset(&msgBytes,0,0x10);
    msgBytes = minBytes;
    iov.iov_base = fdBuffer;
    bVar1 = Maybe<kj::Function<void_(kj::ArrayPtr<kj::AncillaryMessage>)>_>::operator==
                      ((Maybe<kj::Function<void_(kj::ArrayPtr<kj::AncillaryMessage>)>_> *)
                       ((long)buffer + 0x90));
    if (bVar1) {
      local_d0 = (ArrayDisposer *)((alreadyRead.byteCount * 4 + 7 & 0xfffffffffffffff8) + 0x10);
    }
    else {
      local_d0 = (ArrayDisposer *)0x810;
    }
    this_01 = (kj *)((ulong)((long)&local_d0->_vptr_ArrayDisposer + 7U) >> 3);
    if (this_01 < (kj *)0x11) {
      Array<void_*>::Array((Array<void_*> *)&cmsgSpace.size_,(void *)0x0);
      AVar8 = arrayPtr<void*>(&cmsgSpace_heap.disposer,(size_t)this_01);
    }
    else {
      heapArray<void*>((Array<void_*> *)&cmsgSpace.size_,this_01,size);
      AVar8 = kj::Array::operator_cast_to_ArrayPtr((Array *)&cmsgSpace.size_);
    }
    cmsgSpace.ptr = (void **)AVar8.size_;
    cmsgBytes.size_ = (size_t)AVar8.ptr;
    AVar9 = ArrayPtr<void_*>::asBytes((ArrayPtr<void_*> *)&cmsgBytes.size_);
    cmsgBytes.ptr = (uchar *)AVar9.size_;
    _auStack_1b0 = AVar9.ptr;
    __s = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)auStack_1b0);
    sVar3 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)auStack_1b0);
    memset(__s,0,sVar3);
    local_3a8 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)auStack_1b0);
    f_1.exception = (Exception *)&_kjSyscallResult;
    local_1b4 = kj::_::Debug::
                syscall<kj::(anonymous_namespace)::AsyncStreamFd::tryReadInternal(void*,unsigned_long,unsigned_long,kj::OwnFd*,unsigned_long,kj::AsyncCapabilityStream::ReadResult)::_lambda()_2_>
                          ((anon_class_24_3_c5cf561a *)&f_1,true);
    pvVar4 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_1b4);
    if (pvVar4 == (void *)0x0) {
      iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_1b4);
      kj::_::Debug::Fault::Fault
                ((Fault *)&nfds,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x27e,iVar2,"n = ::recvmsg(fd, &msg, RECVMSG_FLAGS)","");
      msg.msg_flags = 5;
      kj::_::Debug::Fault::~Fault((Fault *)&nfds);
    }
    else {
      if (-1 < (long)__kjSyscallResult) {
        spaceLeft = 0;
        ancillaryMessages.builder.disposer = local_d0;
        Vector<kj::AncillaryMessage>::Vector((Vector<kj::AncillaryMessage> *)&cmsg);
        if (local_d0 < (ArrayDisposer *)0x10) {
          local_3a8 = (uchar *)0x0;
        }
        for (len = (WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_>)local_3a8; len != 0;
            len = (WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_>)
                  __cmsg_nxthdr((msghdr *)&iov.iov_len,(cmsghdr *)len)) {
          if (((ancillaryMessages.builder.disposer < (ArrayDisposer *)0x10) ||
              (*(int *)(len + 8) != 1)) || (*(int *)(len + 0xc) != 1)) {
            if (((ArrayDisposer *)0xf < ancillaryMessages.builder.disposer) &&
               (bVar1 = Maybe<kj::Function<void_(kj::ArrayPtr<kj::AncillaryMessage>)>_>::operator==
                                  ((Maybe<kj::Function<void_(kj::ArrayPtr<kj::AncillaryMessage>)>_>
                                    *)((long)buffer + 0x90)), ((bVar1 ^ 0xffU) & 1) != 0)) {
              data_1.size_ = min<unsigned_long&,unsigned_long&>
                                       ((unsigned_long *)len,
                                        (unsigned_long *)&ancillaryMessages.builder.disposer);
              ArrayPtr<const_unsigned_char>::ArrayPtr
                        ((ArrayPtr<const_unsigned_char> *)&_fn701,(uchar *)(len + 0x10),
                         data_1.size_ - 0x10);
              Vector<kj::AncillaryMessage>::add<int&,int&,kj::ArrayPtr<unsigned_char_const>&>
                        ((Vector<kj::AncillaryMessage> *)&cmsg,(int *)(len + 8),(int *)(len + 0xc),
                         (ArrayPtr<const_unsigned_char> *)&_fn701);
            }
          }
          else {
            WVar5 = min<unsigned_long&,unsigned_long&>
                              ((unsigned_long *)len,
                               (unsigned_long *)&ancillaryMessages.builder.disposer);
            AVar10 = arrayPtr<int>((int *)(len + 0x10),WVar5 - 0x10 >> 2);
            trashFds.builder.disposer = (ArrayDisposer *)AVar10.ptr;
            Vector<kj::OwnFd>::Vector((Vector<kj::OwnFd> *)&__range6);
            this_00 = &trashFds.builder.disposer;
            __end6 = ArrayPtr<int>::begin((ArrayPtr<int> *)this_00);
            _ownFd = ArrayPtr<int>::end((ArrayPtr<int> *)this_00);
            for (; __end6 != _ownFd; __end6 = __end6 + 1) {
              local_264 = *__end6;
              OwnFd::OwnFd(&local_268,local_264);
              if (spaceLeft < alreadyRead.byteCount) {
                pOVar6 = mv<kj::OwnFd>(&local_268);
                OwnFd::operator=((OwnFd *)(maxFds + spaceLeft * 4),pOVar6);
                spaceLeft = spaceLeft + 1;
              }
              else {
                pOVar6 = mv<kj::OwnFd>(&local_268);
                Vector<kj::OwnFd>::add<kj::OwnFd>((Vector<kj::OwnFd> *)&__range6,pOVar6);
              }
              OwnFd::~OwnFd(&local_268);
            }
            Vector<kj::OwnFd>::~Vector((Vector<kj::OwnFd> *)&__range6);
          }
          if ((ancillaryMessages.builder.disposer < (ArrayDisposer *)0x10) ||
             (ancillaryMessages.builder.disposer < *(ArrayDisposer **)len)) {
            ancillaryMessages.builder.disposer = (ArrayDisposer *)0x0;
          }
          else {
            ancillaryMessages.builder.disposer =
                 (ArrayDisposer *)((long)ancillaryMessages.builder.disposer - *(long *)len);
          }
        }
        sVar3 = Vector<kj::AncillaryMessage>::size((Vector<kj::AncillaryMessage> *)&cmsg);
        if (sVar3 != 0) {
          this_02 = kj::_::readMaybe<kj::Function<void(kj::ArrayPtr<kj::AncillaryMessage>)>>
                              ((Maybe<kj::Function<void_(kj::ArrayPtr<kj::AncillaryMessage>)>_> *)
                               ((long)buffer + 0x90));
          fn = this_02;
          if (this_02 != (Function<void_(kj::ArrayPtr<kj::AncillaryMessage>)> *)0x0) {
            local_2c0._40_8_ = this_02;
            local_2c0._24_16_ =
                 (undefined1  [16])
                 Vector<kj::AncillaryMessage>::asPtr((Vector<kj::AncillaryMessage> *)&cmsg);
            Function<void_(kj::ArrayPtr<kj::AncillaryMessage>)>::operator()
                      (this_02,(ArrayPtr<kj::AncillaryMessage>)local_2c0._24_16_);
          }
        }
        in_stack_00000018 = (Disposer *)((long)&in_stack_00000018->_vptr_Disposer + spaceLeft);
        n = maxFds + spaceLeft * 4;
        alreadyRead.byteCount = alreadyRead.byteCount - spaceLeft;
        Vector<kj::AncillaryMessage>::~Vector((Vector<kj::AncillaryMessage> *)&cmsg);
      }
      msg.msg_flags = 0;
    }
    Array<void_*>::~Array((Array<void_*> *)&cmsgSpace.size_);
    if (msg.msg_flags == 0) goto LAB_00903bee;
  }
  local_2c0._8_8_ = alreadyRead.capCount;
  local_2c0._16_8_ = in_stack_00000018;
  value.capCount = (size_t)in_stack_00000018;
  value.byteCount = alreadyRead.capCount;
  Promise<kj::AsyncCapabilityStream::ReadResult>::Promise
            ((Promise<kj::AsyncCapabilityStream::ReadResult> *)this,value);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<ReadResult> tryReadInternal(void* buffer, size_t minBytes, size_t maxBytes,
                                      OwnFd* fdBuffer, size_t maxFds,
                                      ReadResult alreadyRead) {
    // `alreadyRead` is the number of bytes we have already received via previous reads -- minBytes,
    // maxBytes, and buffer have already been adjusted to account for them, but this count must
    // be included in the final return value.

    ssize_t n;
    if (maxFds == 0 && ancillaryMsgCallback == kj::none) {
      KJ_NONBLOCKING_SYSCALL(n = ::read(fd, buffer, maxBytes)) {
        // Error.

        // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
        // a bug that exists in both Clang and GCC:
        //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
        //   http://llvm.org/bugs/show_bug.cgi?id=12286
        goto error;
      }
    } else {
      struct msghdr msg;
      memset(&msg, 0, sizeof(msg));

      struct iovec iov;
      memset(&iov, 0, sizeof(iov));
      iov.iov_base = buffer;
      iov.iov_len = maxBytes;
      msg.msg_iov = &iov;
      msg.msg_iovlen = 1;

      // Allocate space to receive a cmsg.
      size_t msgBytes;
      if (ancillaryMsgCallback == kj::none) {
#if __APPLE__ || __FreeBSD__
        // Until very recently (late 2018 / early 2019), FreeBSD suffered from a bug in which when
        // an SCM_RIGHTS message was truncated on delivery, it would not close the FDs that weren't
        // delivered -- they would simply leak: https://bugs.freebsd.org/131876
        //
        // My testing indicates that MacOS has this same bug as of today (April 2019). I don't know
        // if they plan to fix it or are even aware of it.
        //
        // To handle both cases, we will always provide space to receive 512 FDs. Hopefully, this is
        // greater than the maximum number of FDs that these kernels will transmit in one message
        // PLUS enough space for any other ancillary messages that could be sent before the
        // SCM_RIGHTS message to push it back in the buffer. I couldn't find any firm documentation
        // on these limits, though -- I only know that Linux is limited to 253, and I saw a hint in
        // a comment in someone else's application that suggested FreeBSD is the same. Hopefully,
        // then, this is sufficient to prevent attacks. But if not, there's nothing more we can do;
        // it's really up to the kernel to fix this.
        msgBytes = CMSG_SPACE(sizeof(int) * 512);
#else
        msgBytes = CMSG_SPACE(sizeof(int) * maxFds);
#endif
      } else {
        // If we want room for ancillary messages instead of or in addition to FDs, just use the
        // same amount of cushion as in the MacOS/FreeBSD case above.
        // Someday we may want to allow customization here, but there's no immediate use for it.
        msgBytes = CMSG_SPACE(sizeof(int) * 512);
      }

      // On Linux, CMSG_SPACE will align to a word-size boundary, but on Mac it always aligns to a
      // 32-bit boundary. I guess aligning to 32 bits helps avoid the problem where you
      // surprisingly end up with space for two file descriptors when you only wanted one. However,
      // cmsghdr's preferred alignment is word-size (it contains a size_t). If we stack-allocate
      // the buffer, we need to make sure it is aligned properly (maybe not on x64, but maybe on
      // other platforms), so we want to allocate an array of words (we use void*). So... we use
      // CMSG_SPACE() and then additionally round up to deal with Mac.
      size_t msgWords = (msgBytes + sizeof(void*) - 1) / sizeof(void*);
      KJ_STACK_ARRAY(void*, cmsgSpace, msgWords, 16, 256);
      auto cmsgBytes = cmsgSpace.asBytes();
      memset(cmsgBytes.begin(), 0, cmsgBytes.size());
      msg.msg_control = cmsgBytes.begin();
      msg.msg_controllen = msgBytes;

#ifdef MSG_CMSG_CLOEXEC
      static constexpr int RECVMSG_FLAGS = MSG_CMSG_CLOEXEC;
#else
      static constexpr int RECVMSG_FLAGS = 0;
#endif

      KJ_NONBLOCKING_SYSCALL(n = ::recvmsg(fd, &msg, RECVMSG_FLAGS)) {
        // Error.

        // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
        // a bug that exists in both Clang and GCC:
        //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
        //   http://llvm.org/bugs/show_bug.cgi?id=12286
        goto error;
      }

      if (n >= 0) {
        // Process all messages.
        //
        // WARNING DANGER: We have to be VERY careful not to miss a file descriptor here, because
        // if we do, then that FD will never be closed, and a malicious peer could exploit this to
        // fill up our FD table, creating a DoS attack. Some things to keep in mind:
        // - CMSG_SPACE() could have rounded up the space for alignment purposes, and this could
        //   mean we permitted the kernel to deliver more file descriptors than `maxFds`. We need
        //   to close the extras.
        // - We can receive multiple ancillary messages at once. In particular, there is also
        //   SCM_CREDENTIALS. The sender decides what to send. They could send SCM_CREDENTIALS
        //   first followed by SCM_RIGHTS. We need to make sure we see both.
        size_t nfds = 0;
        size_t spaceLeft = msg.msg_controllen;
        Vector<AncillaryMessage> ancillaryMessages;
        for (struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg);
            cmsg != nullptr; cmsg = CMSG_NXTHDR(&msg, cmsg)) {
          if (spaceLeft >= CMSG_LEN(0) &&
              cmsg->cmsg_level == SOL_SOCKET && cmsg->cmsg_type == SCM_RIGHTS) {
            // Some operating systems (like MacOS) do not adjust csmg_len when the message is
            // truncated. We must do so ourselves or risk overrunning the buffer.
            auto len = kj::min(cmsg->cmsg_len, spaceLeft);
            auto data = arrayPtr(reinterpret_cast<int*>(CMSG_DATA(cmsg)),
                                 (len - CMSG_LEN(0)) / sizeof(int));
            kj::Vector<kj::OwnFd> trashFds;
            for (auto fd: data) {
              kj::OwnFd ownFd(fd);
              if (nfds < maxFds) {
                fdBuffer[nfds++] = kj::mv(ownFd);
              } else {
                trashFds.add(kj::mv(ownFd));
              }
            }
          } else if (spaceLeft >= CMSG_LEN(0) && ancillaryMsgCallback != kj::none) {
            auto len = kj::min(cmsg->cmsg_len, spaceLeft);
            auto data = ArrayPtr<const byte>(CMSG_DATA(cmsg), len - CMSG_LEN(0));
            ancillaryMessages.add(cmsg->cmsg_level, cmsg->cmsg_type, data);
          }

          if (spaceLeft >= CMSG_LEN(0) && spaceLeft >= cmsg->cmsg_len) {
            spaceLeft -= cmsg->cmsg_len;
          } else {
            spaceLeft = 0;
          }
        }

#ifndef MSG_CMSG_CLOEXEC
        for (size_t i = 0; i < nfds; i++) {
          setCloseOnExec(fdBuffer[i]);
        }
#endif

        if (ancillaryMessages.size() > 0) {
          KJ_IF_SOME(fn, ancillaryMsgCallback) {
            fn(ancillaryMessages.asPtr());
          }
        }

        alreadyRead.capCount += nfds;
        fdBuffer += nfds;
        maxFds -= nfds;
      }
    }

    if (false) {
    error:
      return alreadyRead;
    }

    if (n < 0) {
      // Read would block.
      return observer.whenBecomesReadable().then(
          [this, buffer, minBytes, maxBytes, fdBuffer, maxFds, alreadyRead]() {
              return tryReadInternal(buffer, minBytes, maxBytes, fdBuffer, maxFds, alreadyRead);
      });
    } else if (n == 0) {
      // EOF -OR- maxBytes == 0.
      return alreadyRead;
    } else if (implicitCast<size_t>(n) >= minBytes) {
      // We read enough to stop here.
      alreadyRead.byteCount += n;
      return alreadyRead;
    } else {
      // The kernel returned fewer bytes than we asked for (and fewer than we need).

      buffer = reinterpret_cast<byte*>(buffer) + n;
      minBytes -= n;
      maxBytes -= n;
      alreadyRead.byteCount += n;

      // According to David Klempner, who works on Stubby at Google, we sadly CANNOT assume that
      // we've consumed the whole read buffer here. If a signal is delivered in the middle of a
      // read() -- yes, even a non-blocking read -- it can cause the kernel to return a partial
      // result, with data still in the buffer.
      //     https://bugzilla.kernel.org/show_bug.cgi?id=199131
      //     https://twitter.com/CaptainSegfault/status/1112622245531144194
      //
      // Unfortunately, we have no choice but to issue more read()s until it either tells us EOF
      // or EAGAIN. We used to have an optimization here using observer.atEndHint() (when it is
      // non-null) to avoid a redundant call to read(). Alas...
      return tryReadInternal(buffer, minBytes, maxBytes, fdBuffer, maxFds, alreadyRead);
    }
  }